

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_butcher.c
# Opt level: O0

int arkode_butcher_order6f
              (sunrealtype *b,sunrealtype **A1,sunrealtype **A2,sunrealtype *c1,sunrealtype **A3,
              sunrealtype *c2,int s)

{
  int iVar1;
  sunrealtype *b_00;
  sunrealtype *b_01;
  sunrealtype *z;
  sunrealtype *in_RCX;
  sunrealtype **in_RDX;
  sunrealtype **in_RSI;
  sunrealtype *in_RDI;
  sunrealtype **in_R8;
  sunrealtype *in_R9;
  double dVar2;
  int in_stack_00000008;
  sunrealtype *tmp3;
  sunrealtype *tmp2;
  sunrealtype *tmp1;
  sunrealtype bAAcAc;
  double local_40;
  sunrealtype *local_38;
  sunrealtype **local_30;
  sunrealtype *local_28;
  sunrealtype **local_20;
  sunrealtype **local_18;
  sunrealtype *local_10;
  uint local_4;
  
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  b_00 = (sunrealtype *)calloc((long)in_stack_00000008,8);
  b_01 = (sunrealtype *)calloc((long)in_stack_00000008,8);
  z = (sunrealtype *)calloc((long)in_stack_00000008,8);
  iVar1 = arkode_butcher_mv(local_20,local_28,in_stack_00000008,b_00);
  if (iVar1 == 0) {
    iVar1 = arkode_butcher_mv(local_18,b_00,in_stack_00000008,b_01);
    if (iVar1 == 0) {
      iVar1 = arkode_butcher_mv(local_30,local_38,in_stack_00000008,b_00);
      if (iVar1 == 0) {
        iVar1 = arkode_butcher_vv(b_00,b_01,in_stack_00000008,z);
        if (iVar1 == 0) {
          iVar1 = arkode_butcher_dot(local_10,z,in_stack_00000008,&local_40);
          if (iVar1 == 0) {
            free(b_00);
            free(b_01);
            free(z);
            dVar2 = sqrt(2.220446049250313e-16);
            local_4 = (uint)(ABS(local_40 - 0.013888888888888888) <= dVar2);
          }
          else {
            local_4 = 0;
          }
        }
        else {
          free(b_00);
          free(b_01);
          free(z);
          local_4 = 0;
        }
      }
      else {
        free(b_00);
        free(b_01);
        free(z);
        local_4 = 0;
      }
    }
    else {
      free(b_00);
      free(b_01);
      free(z);
      local_4 = 0;
    }
  }
  else {
    free(b_00);
    free(b_01);
    free(z);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static sunbooleantype arkode_butcher_order6f(sunrealtype* b, sunrealtype** A1,
                                             sunrealtype** A2, sunrealtype* c1,
                                             sunrealtype** A3, sunrealtype* c2,
                                             int s)
{
  sunrealtype bAAcAc;
  sunrealtype* tmp1 = calloc(s, sizeof(sunrealtype));
  sunrealtype* tmp2 = calloc(s, sizeof(sunrealtype));
  sunrealtype* tmp3 = calloc(s, sizeof(sunrealtype));
  if (arkode_butcher_mv(A2, c1, s, tmp1))
  {
    free(tmp1);
    free(tmp2);
    free(tmp3);
    return (SUNFALSE);
  }
  if (arkode_butcher_mv(A1, tmp1, s, tmp2))
  {
    free(tmp1);
    free(tmp2);
    free(tmp3);
    return (SUNFALSE);
  }
  if (arkode_butcher_mv(A3, c2, s, tmp1))
  {
    free(tmp1);
    free(tmp2);
    free(tmp3);
    return (SUNFALSE);
  }
  if (arkode_butcher_vv(tmp1, tmp2, s, tmp3))
  {
    free(tmp1);
    free(tmp2);
    free(tmp3);
    return (SUNFALSE);
  }
  if (arkode_butcher_dot(b, tmp3, s, &bAAcAc)) { return (SUNFALSE); }
  free(tmp1);
  free(tmp2);
  free(tmp3);
  return (SUNRabs(bAAcAc - SUN_RCONST(1.0) / SUN_RCONST(72.0)) > TOL) ? SUNFALSE
                                                                      : SUNTRUE;
}